

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

StringRefType *
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetSchemaErrorKeyword(SchemaErrorCode schemaErrorCode)

{
  StringRefType *pSVar1;
  
  switch(schemaErrorCode) {
  case kSchemaErrorStartUnknown:
    pSVar1 = GetStartUnknownString();
    return pSVar1;
  case kSchemaErrorRefPlainName:
    pSVar1 = GetRefPlainNameString();
    return pSVar1;
  case kSchemaErrorRefInvalid:
    pSVar1 = GetRefInvalidString();
    return pSVar1;
  case kSchemaErrorRefPointerInvalid:
    pSVar1 = GetRefPointerInvalidString();
    return pSVar1;
  case kSchemaErrorRefUnknown:
    pSVar1 = GetRefUnknownString();
    return pSVar1;
  case kSchemaErrorRefCyclical:
    pSVar1 = GetRefCyclicalString();
    return pSVar1;
  case kSchemaErrorRefNoRemoteProvider:
    pSVar1 = GetRefNoRemoteProviderString();
    return pSVar1;
  case kSchemaErrorRefNoRemoteSchema:
    pSVar1 = GetRefNoRemoteSchemaString();
    return pSVar1;
  case kSchemaErrorRegexInvalid:
    pSVar1 = GetRegexInvalidString();
    return pSVar1;
  case kSchemaErrorSpecUnknown:
    pSVar1 = GetSpecUnknownString();
    return pSVar1;
  case kSchemaErrorSpecUnsupported:
    pSVar1 = GetSpecUnsupportedString();
    return pSVar1;
  case kSchemaErrorSpecIllegal:
    pSVar1 = GetSpecIllegalString();
    return pSVar1;
  case kSchemaErrorReadOnlyAndWriteOnly:
    pSVar1 = GetReadOnlyAndWriteOnlyString();
    return pSVar1;
  }
  if (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
      ::GetNullString()::v == '\0') {
    GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::GetNullString();
  }
  return &GetNullString::v;
}

Assistant:

static const StringRefType& GetSchemaErrorKeyword(SchemaErrorCode schemaErrorCode) {
        switch (schemaErrorCode) {
            case kSchemaErrorStartUnknown:             return GetStartUnknownString();
            case kSchemaErrorRefPlainName:             return GetRefPlainNameString();
            case kSchemaErrorRefInvalid:               return GetRefInvalidString();
            case kSchemaErrorRefPointerInvalid:        return GetRefPointerInvalidString();
            case kSchemaErrorRefUnknown:               return GetRefUnknownString();
            case kSchemaErrorRefCyclical:              return GetRefCyclicalString();
            case kSchemaErrorRefNoRemoteProvider:      return GetRefNoRemoteProviderString();
            case kSchemaErrorRefNoRemoteSchema:        return GetRefNoRemoteSchemaString();
            case kSchemaErrorRegexInvalid:             return GetRegexInvalidString();
            case kSchemaErrorSpecUnknown:              return GetSpecUnknownString();
            case kSchemaErrorSpecUnsupported:          return GetSpecUnsupportedString();
            case kSchemaErrorSpecIllegal:              return GetSpecIllegalString();
            case kSchemaErrorReadOnlyAndWriteOnly:     return GetReadOnlyAndWriteOnlyString();
            default:                                   return GetNullString();
        }
    }